

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

bool SetHasKeys<std::__cxx11::string,char[14],char[21],char[9],char[7],char[11],char[7],char[7],char[11],char[11]>
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *set,char (*key) [14],char (*args) [21],char (*args_1) [9],char (*args_2) [7],
               char (*args_3) [11],char (*args_4) [7],char (*args_5) [7],char (*args_6) [11],
               char (*args_7) [11])

{
  size_type sVar1;
  char (*in_RCX) [21];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  char (*unaff_RBX) [11];
  allocator<char> *in_RSI;
  char (*in_R8) [9];
  char (*in_R9) [7];
  long in_FS_OFFSET;
  char (*unaff_retaddr) [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  key_type *in_stack_ffffffffffffff40;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff48;
  bool local_99;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  char (*in_stack_ffffffffffffff90) [11];
  allocator<char> local_31 [33];
  char (*args_4_00) [7];
  
  args_4_00 = *(char (**) [7])(in_FS_OFFSET + 0x28);
  __s = local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff88,(char *)__s,in_RSI);
  sVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  local_99 = true;
  if (sVar1 == 0) {
    local_99 = SetHasKeys<std::__cxx11::string,char[21],char[9],char[7],char[11],char[7],char[7],char[11],char[11]>
                         (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffff90,
                          (char (*) [7])in_stack_ffffffffffffff88,args_4_00,unaff_RBX,unaff_retaddr)
    ;
    in_stack_ffffffffffffff38 = in_stack_00000010;
  }
  std::__cxx11::string::~string(in_stack_ffffffffffffff38);
  std::allocator<char>::~allocator(local_31);
  if (*(char (**) [7])(in_FS_OFFSET + 0x28) == args_4_00) {
    return local_99;
  }
  __stack_chk_fail();
}

Assistant:

static inline bool SetHasKeys(const std::set<T>& set, const Tk& key, const Args&... args)
{
    return (set.count(key) != 0) || SetHasKeys(set, args...);
}